

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::bootstrap::ptr_assign<chaiscript::dispatch::Proxy_Function_Base_const>
          (bootstrap *this,Boxed_Value *lhs,
          shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *rhs)

{
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Boxed_Value BVar5;
  Type_Info local_48;
  Boxed_Value local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  this_00 = (lhs->m_data).
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((this_00->m_type_info).m_flags & 0x20) == 0) {
    if (((this_00->m_type_info).m_flags & 1) == 0) {
      local_48.m_type_info = (type_info *)&dispatch::Proxy_Function_Base::typeinfo;
      local_48.m_bare_type_info = (type_info *)&dispatch::Proxy_Function_Base::typeinfo;
      local_48.m_flags = 1;
      bVar2 = Type_Info::bare_equal(&this_00->m_type_info,&local_48);
      if (bVar2) goto LAB_00408eb6;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x38);
    *puVar3 = &PTR__bad_cast_005a4ab0;
    puVar3[1] = &Type_Info::Unknown_Type::typeinfo;
    puVar3[2] = &Type_Info::Unknown_Type::typeinfo;
    *(undefined4 *)(puVar3 + 3) = 0x20;
    puVar3[4] = 0;
    puVar3[5] = 0x23;
    puVar3[6] = "type mismatch in pointer assignment";
    __cxa_throw(puVar3,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
  }
LAB_00408eb6:
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base_const>
            ((Object_Data *)&local_48,rhs,false);
  BVar5 = Boxed_Value::assign(&local_30,lhs);
  _Var4._M_pi = BVar5.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info);
    _Var4._M_pi = extraout_RDX_00;
  }
  *(element_type **)this =
       (lhs->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  *(undefined8 *)(this + 8) = 0;
  p_Var1 = (lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (lhs->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
  (lhs->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value ptr_assign(Boxed_Value lhs, const std::shared_ptr<Type> &rhs) {
    if (lhs.is_undef() || (!lhs.get_type_info().is_const() && lhs.get_type_info().bare_equal(chaiscript::detail::Get_Type_Info<Type>::get()))) {
      lhs.assign(Boxed_Value(rhs));
      return lhs;
    } else {
      throw exception::bad_boxed_cast("type mismatch in pointer assignment");
    }
  }